

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

int str_to_int(char *str,int *value)

{
  long lVar1;
  int local_34;
  int base;
  long lval;
  char *str_end;
  int *piStack_18;
  int status;
  int *value_local;
  char *str_local;
  
  str_end._4_4_ = 0;
  local_34 = 0;
  if (*str == '\0') {
    str_end._4_4_ = 1;
  }
  else {
    value_local = (int *)str;
    if (*str == '$') {
      value_local = (int *)(str + 1);
      local_34 = 0x10;
    }
    piStack_18 = value;
    lVar1 = strtol((char *)value_local,(char **)&lval,local_34);
    if (*(char *)lval == '\0') {
      if (piStack_18 != (int *)0x0) {
        *piStack_18 = (int)lVar1;
      }
    }
    else {
      str_end._4_4_ = 1;
    }
  }
  return str_end._4_4_;
}

Assistant:

int str_to_int(const char *str, int *value)
{
    int status = 0;
    do {
        char *str_end;
        long lval;

        /* base 0 is auto detect */
        int base = 0;

        if (*str == '\0')
        {
            /* no string to parse */
            status = 1;
            break;
        }

        if (*str == '$')
        {
            /* a $ prefix specifies base 16 */
            ++str;
            base = 16;
        }

        lval = strtol(str, &str_end, base);

        if(*str_end != '\0')
        {
            /* there is garbage in the string */
            status = 1;
            break;
        }

        if(value != NULL)
        {
            /* all is well, set the out parameter */
            *value = (int)lval;
        }
    } while(0);

    return status;
}